

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O2

int SSL_CREDENTIAL_set1_signing_algorithm_prefs
              (SSL_CREDENTIAL *cred,uint16_t *prefs,size_t num_prefs)

{
  bool bVar1;
  int line;
  Span<const_unsigned_short> prefs_00;
  
  bVar1 = ssl_credential_st::UsesPrivateKey(cred);
  if (bVar1) {
    if (cred->type != kDelegated) {
      prefs_00.size_ = num_prefs;
      prefs_00.data_ = prefs;
      bVar1 = set_sigalg_prefs(&cred->sigalgs,prefs_00);
      return (uint)bVar1;
    }
    line = 0x252;
  }
  else {
    line = 0x24b;
  }
  ERR_put_error(0x10,0,0x42,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                ,line);
  return 0;
}

Assistant:

int SSL_CREDENTIAL_set1_signing_algorithm_prefs(SSL_CREDENTIAL *cred,
                                                const uint16_t *prefs,
                                                size_t num_prefs) {
  if (!cred->UsesPrivateKey()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  // Delegated credentials are constrained to a single algorithm, so there is no
  // need to configure this.
  if (cred->type == SSLCredentialType::kDelegated) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  return set_sigalg_prefs(&cred->sigalgs, Span(prefs, num_prefs));
}